

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

int64_t __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_int64_value
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  byte *pbVar1;
  uint uVar2;
  uint64_t uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  byte *pbVar7;
  uint8_t b;
  uint8_t buf_2 [2];
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_37;
  ushort local_36;
  uint local_34;
  ulong local_30;
  
  pbVar7 = (this->source_).current_;
  pbVar1 = (this->source_).end_;
  uVar2 = 0x100;
  if (pbVar7 < pbVar1) {
    uVar2 = (uint)*pbVar7;
  }
  if (0xff < uVar2) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return 0;
  }
  bVar4 = (byte)uVar2 >> 5;
  if (bVar4 == 0) {
    uVar3 = get_uint64_value(this,ec);
    if ((long)uVar3 < 1) {
      uVar3 = 0;
    }
    if (ec->_M_value == 0) {
      return uVar3;
    }
    return 0;
  }
  if (bVar4 == 1) {
    bVar4 = (byte)uVar2 & 0x1f;
    pbVar7 = pbVar7 + (pbVar1 != pbVar7);
    (this->source_).current_ = pbVar7;
    if (bVar4 < 0x18) {
      return (long)(char)~bVar4;
    }
    switch(bVar4) {
    case 0x18:
      memcpy(&local_37,pbVar7,(ulong)(pbVar1 != pbVar7));
      (this->source_).current_ = pbVar7 + (pbVar1 != pbVar7);
      if (pbVar1 == pbVar7) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar6 = ~(ulong)local_37;
      break;
    case 0x19:
      uVar6 = (long)pbVar1 - (long)pbVar7;
      sVar5 = 2;
      if (uVar6 < 2) {
        sVar5 = uVar6;
      }
      memcpy(&local_36,pbVar7,sVar5);
      (this->source_).current_ = pbVar7 + sVar5;
      if (uVar6 < 2) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar6 = ~(ulong)(ushort)(local_36 << 8 | local_36 >> 8);
      break;
    case 0x1a:
      uVar6 = (long)pbVar1 - (long)pbVar7;
      sVar5 = 4;
      if (uVar6 < 4) {
        sVar5 = uVar6;
      }
      memcpy(&local_34,pbVar7,sVar5);
      (this->source_).current_ = pbVar7 + sVar5;
      if (uVar6 < 4) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      uVar6 = ~(ulong)(local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
                      local_34 << 0x18);
      break;
    case 0x1b:
      uVar6 = (long)pbVar1 - (long)pbVar7;
      sVar5 = 8;
      if (uVar6 < 8) {
        sVar5 = uVar6;
      }
      memcpy(&local_30,pbVar7,sVar5);
      (this->source_).current_ = pbVar7 + sVar5;
      if (uVar6 < 8) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0;
      }
      local_30 = ~local_30;
      uVar6 = local_30 >> 0x38 | (local_30 & 0xff000000000000) >> 0x28 |
              (local_30 & 0xff0000000000) >> 0x18 | (local_30 & 0xff00000000) >> 8 |
              (local_30 & 0xff000000) << 8 | (local_30 & 0xff0000) << 0x18 |
              (local_30 & 0xff00) << 0x28 | local_30 << 0x38;
      break;
    default:
      goto switchD_0025d11d_default;
    }
  }
  else {
switchD_0025d11d_default:
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }